

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_child(Context *context,IntrinsicResult partialResult)

{
  bool bVar1;
  anon_union_8_3_2f476f46_for_data *this;
  String pathSep;
  String filename;
  anon_union_8_3_2f476f46_for_data local_88 [2];
  Value local_78;
  Value local_68;
  String path;
  anon_union_8_3_2f476f46_for_data local_48 [2];
  String local_38;
  String local_28;
  
  MiniScript::String::String(&local_28,"parentPath");
  MiniScript::Context::GetVar
            ((Context *)&filename,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::Value::ToString((Value *)&path,(Machine *)&filename);
  MiniScript::Value::~Value((Value *)&filename);
  MiniScript::String::release(&local_28);
  MiniScript::String::String(&local_38,"childName");
  MiniScript::Context::GetVar
            ((Context *)&pathSep,(String *)partialResult.rs,(LocalOnlyMode)&local_38);
  MiniScript::Value::ToString((Value *)&filename,(Machine *)&pathSep);
  MiniScript::Value::~Value((Value *)&pathSep);
  MiniScript::String::release(&local_38);
  MiniScript::String::String(&pathSep,"/");
  bVar1 = MiniScript::String::EndsWith(&path,&pathSep);
  if (bVar1) {
    MiniScript::String::operator+((String *)local_88,&path);
    local_68.type = String;
    local_68.noInvoke = false;
    local_68.localOnly = Off;
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_88[0].ref ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_88[0] = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
    }
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_88[0].ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      (local_88[0].ref)->refCount = (local_88[0].ref)->refCount + 1;
    }
    local_68.data = local_88[0];
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_68,true);
    MiniScript::Value::~Value(&local_68);
    this = local_88;
  }
  else {
    MiniScript::String::operator+((String *)local_48,&path);
    MiniScript::String::operator+((String *)local_88,(String *)local_48);
    local_78.type = String;
    local_78.noInvoke = false;
    local_78.localOnly = Off;
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_88[0].ref ==
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      local_88[0] = (anon_union_8_3_2f476f46_for_data)MiniScript::Value::emptyString._8_8_;
    }
    if ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_88[0].ref !=
        (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
      (local_88[0].ref)->refCount = (local_88[0].ref)->refCount + 1;
    }
    local_78.data = local_88[0];
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_78,true);
    MiniScript::Value::~Value(&local_78);
    MiniScript::String::release((String *)local_88);
    this = local_48;
  }
  MiniScript::String::release((String *)this);
  MiniScript::String::release(&pathSep);
  MiniScript::String::release(&filename);
  MiniScript::String::release(&path);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_child(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("parentPath").ToString();
	String filename = context->GetVar("childName").ToString();
	#if _WIN32 || _WIN64
		String pathSep = "\\";
	#else
		String pathSep = "/";
	#endif
	if (path.EndsWith(pathSep)) return IntrinsicResult(path + filename);
	return IntrinsicResult(path + pathSep + filename);
}